

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# agent_coop.cpp
# Opt level: O3

void __thiscall
so_5::coop_t::do_deregistration_specific_actions(coop_t *this,coop_dereg_reason_t dereg_reason)

{
  pointer paVar1;
  
  (this->m_dereg_reason).m_reason = dereg_reason.m_reason;
  paVar1 = (this->m_agent_array).
           super__Vector_base<so_5::coop_t::agent_with_disp_binder_t,_std::allocator<so_5::coop_t::agent_with_disp_binder_t>_>
           ._M_impl.super__Vector_impl_data._M_start;
  if (paVar1 != (this->m_agent_array).
                super__Vector_base<so_5::coop_t::agent_with_disp_binder_t,_std::allocator<so_5::coop_t::agent_with_disp_binder_t>_>
                ._M_impl.super__Vector_impl_data._M_finish) {
    do {
      agent_t::shutdown_agent((paVar1->m_agent_ref).m_obj);
      paVar1 = paVar1 + 1;
    } while (paVar1 != (this->m_agent_array).
                       super__Vector_base<so_5::coop_t::agent_with_disp_binder_t,_std::allocator<so_5::coop_t::agent_with_disp_binder_t>_>
                       ._M_impl.super__Vector_impl_data._M_finish);
  }
  decrement_usage_count(this);
  return;
}

Assistant:

void
coop_t::do_deregistration_specific_actions(
	coop_dereg_reason_t dereg_reason )
{
	m_dereg_reason = std::move( dereg_reason );

	shutdown_all_agents();

	// Reference count could decremented.
	// If coop was an empty coop then this action initiates the whole
	// coop deregistration.
	decrement_usage_count();
}